

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

double Gudhi::Persistence_representations::compute_maximal_distance_non_symmetric
                 (Persistence_landscape *pl1,Persistence_landscape *pl2)

{
  double dVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  size_t level_1;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  size_t i;
  long lVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  pvVar2 = (pl1->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(pl1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
  pvVar3 = (pl2->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(pl2->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18;
  uVar7 = uVar5;
  if (uVar6 < uVar5) {
    uVar7 = uVar6;
  }
  dVar14 = 0.0;
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    lVar4 = *(long *)&pvVar2[uVar8].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl;
    lVar11 = 0;
    for (lVar10 = 1;
        lVar10 != ((long)*(pointer *)
                          ((long)&pvVar2[uVar8].
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl + 8) - lVar4 >> 4) + -1; lVar10 = lVar10 + 1) {
      dVar16 = *(double *)(lVar4 + lVar10 * 0x10);
      lVar11 = (long)(int)lVar11;
      for (pdVar9 = (double *)
                    (*(long *)&pvVar3[uVar8].
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl + lVar11 * 0x10 + 0x18);
          (dVar1 = pdVar9[-3], dVar16 < dVar1 || (pdVar9[-1] < dVar16)); pdVar9 = pdVar9 + 2) {
        lVar11 = lVar11 + 1;
      }
      dVar15 = (*pdVar9 - pdVar9[-2]) / (pdVar9[-1] - dVar1);
      dVar16 = ABS((dVar15 * dVar16 + (pdVar9[-2] - dVar1 * dVar15)) -
                   *(double *)(lVar4 + lVar10 * 0x10 + 8));
      uVar13 = -(ulong)(dVar14 <= dVar16);
      dVar14 = (double)(~uVar13 & (ulong)dVar14 | (ulong)dVar16 & uVar13);
    }
  }
  if (uVar6 < uVar5) {
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      lVar4 = *(long *)&pvVar2[uVar6].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl;
      lVar10 = (long)*(pointer *)
                      ((long)&pvVar2[uVar6].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8) - lVar4 >> 4;
      pdVar9 = (double *)(lVar4 + 8);
      while (bVar12 = lVar10 != 0, lVar10 = lVar10 + -1, bVar12) {
        dVar16 = *pdVar9;
        if (*pdVar9 <= dVar14) {
          dVar16 = dVar14;
        }
        dVar14 = dVar16;
        pdVar9 = pdVar9 + 2;
      }
    }
  }
  return dVar14;
}

Assistant:

void Persistence_landscape::load_landscape_from_file(const char* filename) {
  bool dbg = false;
  // removing the current content of the persistence landscape.
  this->land.clear();

  // this constructor reads persistence landscape form a file. This file have to be created by this software before head
  std::ifstream in;
  in.open(filename);
  if (!in.good()) {
    std::cerr << "The file : " << filename << " do not exist. The program will now terminate \n";
    throw "The persistence landscape file do not exist. The program will now terminate \n";
  }

  std::string line;
  std::vector<std::pair<double, double> > landscapeAtThisLevel;

  bool isThisAFirsLine = true;
  while (in.good()) {
    getline(in, line);
    if (!(line.length() == 0 || line[0] == '#')) {
      std::stringstream lineSS;
      lineSS << line;
      double beginn, endd;
      lineSS >> beginn;
      lineSS >> endd;
      landscapeAtThisLevel.push_back(std::make_pair(beginn, endd));
      if (dbg) {
        std::clog << "Reading a point : " << beginn << " , " << endd << std::endl;
      }
    } else {
      if (dbg) {
        std::clog << "IGNORE LINE\n";
        getchar();
      }
      if (!isThisAFirsLine) {
        landscapeAtThisLevel.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
        this->land.push_back(landscapeAtThisLevel);
        std::vector<std::pair<double, double> > newLevelOdLandscape;
        landscapeAtThisLevel.swap(newLevelOdLandscape);
      }
      landscapeAtThisLevel.push_back(std::make_pair(-std::numeric_limits<int>::max(), 0));
      isThisAFirsLine = false;
    }
  }
  if (landscapeAtThisLevel.size() > 1) {
    // seems that the last line of the file is not finished with the newline sign. We need to put what we have in
    // landscapeAtThisLevel to the constructed landscape.
    landscapeAtThisLevel.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
    this->land.push_back(landscapeAtThisLevel);
  }

  in.close();
}